

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vi.c
# Opt level: O0

el_action_t vi_zero(EditLine *el,wint_t c)

{
  wint_t c_local;
  EditLine *el_local;
  
  if ((el->el_state).doingarg == L'\0') {
    (el->el_line).cursor = (el->el_line).buffer;
    if ((el->el_chared).c_vcmd.action == L'\0') {
      el_local._7_1_ = '\x05';
    }
    else {
      cv_delfini(el);
      el_local._7_1_ = '\x04';
    }
  }
  else {
    el_local._7_1_ = ed_argument_digit(el,c);
  }
  return el_local._7_1_;
}

Assistant:

libedit_private el_action_t
vi_zero(EditLine *el, wint_t c)
{

	if (el->el_state.doingarg)
		return ed_argument_digit(el, c);

	el->el_line.cursor = el->el_line.buffer;
	if (el->el_chared.c_vcmd.action != NOP) {
		cv_delfini(el);
		return CC_REFRESH;
	}
	return CC_CURSOR;
}